

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall JSONTest_Stringify_Test::JSONTest_Stringify_Test(JSONTest_Stringify_Test *this)

{
  JSONTest_Stringify_Test *this_local;
  
  testing::Test::Test(&this->super_JSONTest);
  (this->super_JSONTest)._vptr_Test = (_func_int **)&PTR__JSONTest_Stringify_Test_00570568;
  return;
}

Assistant:

TEST_F(JSONTest, Stringify) {
  // TODO: change the API to not require a copy
  auto input = "[\"hello\",\"world\"]";
  auto* copy = strdup(input);
  json::Value value;
  value.parse(copy, json::Value::ASCII);
  std::stringstream ss;
  value.stringify(ss);
  EXPECT_EQ(ss.str(), input);
  free(copy);
}